

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O3

void __thiscall ncnn::ParamDict::clear(ParamDict *this)

{
  undefined4 *puVar1;
  int *piVar2;
  long lVar3;
  long *plVar4;
  long lVar5;
  long local_58;
  int *piStack_50;
  undefined8 local_48;
  long *plStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  lVar5 = 0;
  do {
    *(undefined4 *)((long)&this->params[0].loaded + lVar5) = 0;
    local_38 = 0;
    uStack_30 = 0;
    local_48 = 0;
    plStack_40 = (long *)0x0;
    local_58 = 0;
    piStack_50 = (int *)0x0;
    local_28 = 0;
    if ((long *)((long)&this->params[0].v.data + lVar5) != &local_58) {
      piVar2 = *(int **)((long)&this->params[0].v.refcount + lVar5);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          lVar3 = *(long *)((long)&this->params[0].v.data + lVar5);
          plVar4 = *(long **)((long)&this->params[0].v.allocator + lVar5);
          if (plVar4 == (long *)0x0) {
            if (lVar3 != 0) {
              free(*(void **)(lVar3 + -8));
            }
          }
          else {
            (**(code **)(*plVar4 + 8))();
          }
        }
      }
      *(long *)((long)&this->params[0].v.data + lVar5) = local_58;
      *(int **)((long)&this->params[0].v.refcount + lVar5) = piStack_50;
      *(undefined8 *)((long)&this->params[0].v.elemsize + lVar5) = local_48;
      *(long **)((long)&this->params[0].v.allocator + lVar5) = plStack_40;
      puVar1 = (undefined4 *)((long)&this->params[0].v.dims + lVar5);
      *puVar1 = (undefined4)local_38;
      puVar1[1] = local_38._4_4_;
      puVar1[2] = (undefined4)uStack_30;
      puVar1[3] = uStack_30._4_4_;
      *(undefined8 *)((long)&this->params[0].v.cstep + lVar5) = local_28;
      if (piStack_50 != (int *)0x0) {
        LOCK();
        *piStack_50 = *piStack_50 + -1;
        UNLOCK();
        if (*piStack_50 == 0) {
          if (plStack_40 == (long *)0x0) {
            if (local_58 != 0) {
              free(*(void **)(local_58 + -8));
            }
          }
          else {
            (**(code **)(*plStack_40 + 8))();
          }
        }
      }
    }
    lVar5 = lVar5 + 0x40;
  } while (lVar5 != 0x500);
  return;
}

Assistant:

void ParamDict::clear()
{
    for (int i = 0; i < NCNN_MAX_PARAM_COUNT; i++)
    {
        params[i].loaded = 0;
        params[i].v = Mat();
    }
}